

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O2

Function * input(string *s)

{
  Function *pFVar1;
  string asStack_38 [32];
  
  pFVar1 = inputX();
  std::__cxx11::string::string(asStack_38,(string *)s);
  std::__cxx11::string::_M_assign((string *)&pFVar1->sName);
  std::__cxx11::string::~string(asStack_38);
  return pFVar1;
}

Assistant:

Function &input(string s)
{
	return inputX().setName(s);
}